

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

void __thiscall
QOpenGLTexture::setComparisonFunction(QOpenGLTexture *this,ComparisonFunction function)

{
  QOpenGLTexturePrivate *this_00;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  QOpenGLTexturePrivate::create(this_00);
  if (((this_00->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
       super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x4000) == 0) {
    local_38[0] = '\x02';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_20 = "default";
    QMessageLogger::warning
              (local_38,
               "QOpenGLTexture::setComparisonFunction: requires OpenGL >= 1.5 or OpenGL ES >= 3.0");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else {
    this_00->comparisonFunction = function;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QOpenGLTextureHelper::glTextureParameteri
                (this_00->texFuncs,this_00->textureId,this_00->target,this_00->bindingTarget,0x884d,
                 function);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTexture::setComparisonFunction(QOpenGLTexture::ComparisonFunction function)
{
    Q_D(QOpenGLTexture);
    d->create();
    if (!d->features.testFlag(TextureComparisonOperators)) {
        qWarning("QOpenGLTexture::setComparisonFunction: requires OpenGL >= 1.5 or OpenGL ES >= 3.0");
        return;
    }
    d->comparisonFunction = function;
    d->texFuncs->glTextureParameteri(d->textureId, d->target, d->bindingTarget, GL_TEXTURE_COMPARE_FUNC, function);
}